

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QList<Qt::GestureType> * __thiscall
QHash<Qt::GestureType,_int>::keys(QHash<Qt::GestureType,_int> *this)

{
  key_iterator i1;
  QList<Qt::GestureType> *in_RDI;
  undefined1 in_stack_00000020 [16];
  Data<QHashPrivate::Node<Qt::GestureType,_int>_> *in_stack_00000030;
  QList<Qt::GestureType> *this_00;
  undefined8 local_30;
  
  this_00 = in_RDI;
  keyBegin(local_30);
  keyEnd(local_30);
  i1.i.i.bucket = (size_t)this;
  i1.i.i.d = in_stack_00000030;
  QList<Qt::GestureType>::QList<QHash<Qt::GestureType,_int>::key_iterator,_true>
            (this_00,i1,(key_iterator)in_stack_00000020);
  return in_RDI;
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }